

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O1

void __thiscall
MemoryFile_FileIsInitiallyEmpty_Test::TestBody(MemoryFile_FileIsInitiallyEmpty_Test *this)

{
  _func_int **message;
  char *message_00;
  AssertionResult gtest_ar;
  in_memory mf;
  AssertHelper local_70;
  undefined1 local_68 [8];
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> _Stack_60;
  MemoryFile local_58;
  in_memory local_48;
  
  anon_unknown.dwarf_1432f::MemoryFile::make_buffer(&local_58,0xd);
  local_68 = (undefined1  [8])local_58.super_Test._vptr_Test;
  _Stack_60._M_head_impl =
       (GTestFlagSaver *)
       local_58.super_Test.gtest_flag_saver_._M_t.
       super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
       .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  local_58.super_Test._vptr_Test = (_func_int **)0x0;
  local_58.super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (__uniq_ptr_data<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>,_true,_true>
        )(__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
          )0x0;
  pstore::file::in_memory::in_memory(&local_48,(shared_ptr<void> *)local_68,0xd,0,true);
  if (_Stack_60._M_head_impl != (GTestFlagSaver *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._M_head_impl);
  }
  local_70.data_._0_4_ = 0;
  local_58.super_Test._vptr_Test = (_func_int **)local_48.pos_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_68,"0U","mf.tell ()",(uint *)&local_70,(unsigned_long *)&local_58);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_58.super_Test._vptr_Test + 2),
               "Expected the initial file offset to be 0",0x28);
    if (_Stack_60._M_head_impl == (GTestFlagSaver *)0x0) {
      message = (_func_int **)0x1ae738;
    }
    else {
      message = (_func_int **)
                ((_Alloc_hider *)&(_Stack_60._M_head_impl)->also_run_disabled_tests_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1b3,(char *)message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58.super_Test._vptr_Test != (_func_int **)0x0) {
      (**(code **)(*local_58.super_Test._vptr_Test + 8))();
    }
  }
  if (_Stack_60._M_head_impl != (GTestFlagSaver *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_60._M_head_impl);
  }
  local_70.data_._0_4_ = 0;
  local_58.super_Test._vptr_Test = (_func_int **)local_48.eof_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_68,"0U","mf.size ()",(uint *)&local_70,(unsigned_long *)&local_58);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_58.super_Test._vptr_Test + 2),
               "Expected the file to be initially empty",0x27);
    if (_Stack_60._M_head_impl == (GTestFlagSaver *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((_Alloc_hider *)&(_Stack_60._M_head_impl)->also_run_disabled_tests_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1b4,message_00);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58.super_Test._vptr_Test != (_func_int **)0x0) {
      (**(code **)(*local_58.super_Test._vptr_Test + 8))();
    }
  }
  if (_Stack_60._M_head_impl != (GTestFlagSaver *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_60._M_head_impl);
  }
  if (local_48.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pstore::file::file_base::~file_base(&local_48.super_file_base);
  return;
}

Assistant:

TEST_F (MemoryFile, FileIsInitiallyEmpty) {
    constexpr std::size_t elements = 13;
    pstore::file::in_memory mf (MemoryFile::make_buffer (elements), elements);
    EXPECT_EQ (0U, mf.tell ()) << "Expected the initial file offset to be 0";
    EXPECT_EQ (0U, mf.size ()) << "Expected the file to be initially empty";
}